

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O0

DOMElement * __thiscall
xercesc_4_0::SchemaInfo::getTopLevelComponent
          (SchemaInfo *this,unsigned_short compCategory,XMLCh *compName,XMLCh *name)

{
  bool bVar1;
  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *this_00;
  DOMElement *pDVar2;
  XMLCh *pXVar3;
  XMLCh *rName;
  DOMElement *redefineChild;
  XMLCh *cName;
  DOMElement *redefParent;
  DOMElement *cachedChild;
  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *local_40;
  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *compList;
  DOMElement *child;
  XMLCh *name_local;
  XMLCh *compName_local;
  SchemaInfo *pSStack_18;
  unsigned_short compCategory_local;
  SchemaInfo *this_local;
  
  if ((this->fSchemaRootElement == (DOMElement *)0x0) || (6 < compCategory)) {
    this_local = (SchemaInfo *)0x0;
  }
  else {
    child = (DOMElement *)name;
    name_local = compName;
    compName_local._6_2_ = compCategory;
    pSStack_18 = this;
    compList = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
               XUtil::getFirstChildElement(&this->fSchemaRootElement->super_DOMNode);
    if (compList == (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0) {
      this_local = (SchemaInfo *)0x0;
    }
    else {
      local_40 = this->fTopLevelComponents[compName_local._6_2_];
      if (this->fTopLevelComponents[compName_local._6_2_] ==
          (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0) {
        this_00 = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
                  XMemory::operator_new(0x38,this->fMemoryManager);
        RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::RefHashTableOf
                  (this_00,0x11,false,this->fMemoryManager);
        this->fTopLevelComponents[compName_local._6_2_] = this_00;
        local_40 = this_00;
      }
      else {
        pDVar2 = RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::get
                           (local_40,child);
        if (pDVar2 != (DOMElement *)0x0) {
          return pDVar2;
        }
        compList = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
                   this->fLastTopLevelComponent[compName_local._6_2_];
        redefParent = (DOMElement *)0x0;
      }
      cName = (XMLCh *)(*(code *)compList->fMemoryManager[5]._vptr_MemoryManager)();
      pXVar3 = (XMLCh *)(**(code **)(*(long *)cName + 0xc0))();
      bVar1 = XMLString::equals(pXVar3,(XMLCh *)SchemaSymbols::fgELT_REDEFINE);
      if (!bVar1) {
        cName = (XMLCh *)0x0;
      }
      while (compList != (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0)
      {
        this->fLastTopLevelComponent[compName_local._6_2_] = (DOMElement *)compList;
        pXVar3 = (XMLCh *)(*(code *)compList->fMemoryManager[0x18]._vptr_MemoryManager)();
        bVar1 = XMLString::equals(pXVar3,name_local);
        if (bVar1) {
          redefineChild =
               (DOMElement *)
               (*(code *)compList->fMemoryManager[0x29]._vptr_MemoryManager)
                         (compList,SchemaSymbols::fgATT_NAME);
          RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                    (local_40,redefineChild,(DOMElement *)compList);
          bVar1 = XMLString::equals((XMLCh *)redefineChild,(XMLCh *)child);
          if (bVar1) {
            return (DOMElement *)compList;
          }
        }
        else {
          pXVar3 = (XMLCh *)(*(code *)compList->fMemoryManager[0x18]._vptr_MemoryManager)();
          bVar1 = XMLString::equals(pXVar3,(XMLCh *)SchemaSymbols::fgELT_REDEFINE);
          if ((bVar1) &&
             ((this->fFailedRedefineList == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0 ||
              (bVar1 = ValueVectorOf<const_xercesc_4_0::DOMElement_*>::containsElement
                                 (this->fFailedRedefineList,(DOMElement **)&compList,0), !bVar1))))
          {
            for (rName = (XMLCh *)XUtil::getFirstChildElement((DOMNode *)compList);
                rName != (XMLCh *)0x0;
                rName = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)rName)) {
              this->fLastTopLevelComponent[compName_local._6_2_] = (DOMElement *)rName;
              if ((this->fFailedRedefineList ==
                   (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) ||
                 (bVar1 = ValueVectorOf<const_xercesc_4_0::DOMElement_*>::containsElement
                                    (this->fFailedRedefineList,(DOMElement **)&rName,0), !bVar1)) {
                pXVar3 = (XMLCh *)(**(code **)(*(long *)rName + 0xc0))();
                bVar1 = XMLString::equals(pXVar3,name_local);
                if (bVar1) {
                  pXVar3 = (XMLCh *)(**(code **)(*(long *)rName + 0x148))
                                              (rName,SchemaSymbols::fgATT_NAME);
                  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                            (local_40,pXVar3,(DOMElement *)rName);
                  bVar1 = XMLString::equals(pXVar3,(XMLCh *)child);
                  if (bVar1) {
                    return (DOMElement *)rName;
                  }
                }
              }
            }
          }
        }
        compList = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
                   XUtil::getNextSiblingElement((DOMNode *)compList);
        if ((compList == (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0)
           && (cName != (XMLCh *)0x0)) {
          compList = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
                     XUtil::getNextSiblingElement((DOMNode *)cName);
          cName = (XMLCh *)0x0;
        }
      }
      this_local = (SchemaInfo *)compList;
    }
  }
  return (DOMElement *)this_local;
}

Assistant:

DOMElement*
SchemaInfo::getTopLevelComponent(const unsigned short compCategory,
                                 const XMLCh* const compName,
                                 const XMLCh* const name) {

    if (fSchemaRootElement == 0 || compCategory >= C_Count)
      return 0;

    DOMElement* child = XUtil::getFirstChildElement(fSchemaRootElement);

    if (!child)
        return 0;

    RefHashTableOf<DOMElement>* compList = fTopLevelComponents[compCategory];

    if (fTopLevelComponents[compCategory] == 0) {

        compList= new (fMemoryManager) RefHashTableOf<DOMElement>(17, false, fMemoryManager);
        fTopLevelComponents[compCategory] = compList;
    }
    else {
        DOMElement* cachedChild = compList->get(name);
        if(cachedChild)
            return cachedChild;

        child = fLastTopLevelComponent[compCategory];
    }

    DOMElement* redefParent = (DOMElement*) child->getParentNode();

    // Parent is not "redefine"
    if (!XMLString::equals(redefParent->getLocalName(),SchemaSymbols::fgELT_REDEFINE))
        redefParent = 0;

    while (child != 0) {

        fLastTopLevelComponent[compCategory]=child;
        if (XMLString::equals(child->getLocalName(), compName)) {

            const XMLCh* cName=child->getAttribute(SchemaSymbols::fgATT_NAME);
            compList->put((void*)cName, child);

            if (XMLString::equals(cName, name))
                return child;
        }
        else if (XMLString::equals(child->getLocalName(),SchemaSymbols::fgELT_REDEFINE)
                 && (!fFailedRedefineList || !fFailedRedefineList->containsElement(child))) { // if redefine

            DOMElement* redefineChild = XUtil::getFirstChildElement(child);

            while (redefineChild != 0) {

                fLastTopLevelComponent[compCategory]=redefineChild;
                if ((!fFailedRedefineList || !fFailedRedefineList->containsElement(redefineChild))
                    && XMLString::equals(redefineChild->getLocalName(), compName)) {

                    const XMLCh* rName=redefineChild->getAttribute(SchemaSymbols::fgATT_NAME);
                    compList->put((void*)rName, redefineChild);

                    if (XMLString::equals(rName, name))
                        return redefineChild;
                }

                redefineChild = XUtil::getNextSiblingElement(redefineChild);
            }
        }

        child = XUtil::getNextSiblingElement(child);

        if (child == 0 && redefParent) {

            child = XUtil::getNextSiblingElement(redefParent);
            redefParent = 0;
        }
    }

    return child;
}